

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrWorldMeshBufferML *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  allocator local_152;
  allocator local_151;
  string *local_150;
  string local_148;
  string error_message;
  string local_108;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_150 = command_name;
  if (value->type != XR_TYPE_WORLD_MESH_BUFFER_ML) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrWorldMeshBufferML",value->type,
               "VUID-XrWorldMeshBufferML-type-type",XR_TYPE_WORLD_MESH_BUFFER_ML,
               "XR_TYPE_WORLD_MESH_BUFFER_ML");
  }
  if (!check_pnext) goto LAB_001b6c83;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,local_150,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_148);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_148,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string
              ((string *)&local_148,"VUID-XrWorldMeshBufferML-next-unique",&local_152);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_108,
               "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBufferML struct"
               ,&local_151);
    CoreValidLogMessage(instance_info,&local_148,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_150,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_148);
LAB_001b6c51:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrWorldMeshBufferML-next-next",(allocator *)&local_108
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_148,
               "Invalid structure(s) in \"next\" chain for XrWorldMeshBufferML struct \"next\"",
               &local_152);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_150,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_001b6c51;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001b6c83:
  if (check_members && XVar2 == XR_SUCCESS) {
    XVar2 = XR_SUCCESS;
    if ((value->bufferSize == 0) && (value->buffer != (void *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrWorldMeshBufferML-bufferSize-arraylength",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,objects_info);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "Structure XrWorldMeshBufferML member bufferSize is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_150,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
    if ((value->buffer == (void *)0x0) && (value->bufferSize != 0)) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrWorldMeshBufferML-buffer-parameter",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_a8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "XrWorldMeshBufferML contains invalid NULL for void \"buffer\" is which not optional since \"bufferSize\" is set and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_150,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_a8,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_a8);
      std::__cxx11::string::~string((string *)&error_message);
      XVar2 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrWorldMeshBufferML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_WORLD_MESH_BUFFER_ML) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrWorldMeshBufferML",
                             value->type, "VUID-XrWorldMeshBufferML-type-type", XR_TYPE_WORLD_MESH_BUFFER_ML, "XR_TYPE_WORLD_MESH_BUFFER_ML");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBufferML-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrWorldMeshBufferML struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrWorldMeshBufferML : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBufferML-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrWorldMeshBufferML struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->bufferSize && nullptr != value->buffer) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBufferML-bufferSize-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrWorldMeshBufferML member bufferSize is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->buffer && 0 != value->bufferSize) {
        CoreValidLogMessage(instance_info, "VUID-XrWorldMeshBufferML-buffer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrWorldMeshBufferML contains invalid NULL for void \"buffer\" is which not "
                            "optional since \"bufferSize\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}